

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_extract(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  extract_aux_data sAux;
  
  if (((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) ||
     (pMap = (jx9_hashmap *)((*apArg)->x).pOther, pMap->nEntry == 0)) {
    sAux.iCount = 0;
  }
  else {
    SyZero(&sAux,0x20);
    if (nArg != 1) {
      sAux.iFlags = jx9_value_to_int(apArg[1]);
      if (2 < (uint)nArg) {
        sAux.zPrefix = jx9_value_to_string(apArg[2],&sAux.Prefixlen);
      }
    }
    sAux.pVm = pCtx->pVm;
    jx9HashmapWalk(pMap,VmExtractCallback,&sAux);
  }
  jx9_result_int(pCtx,sAux.iCount);
  return 0;
}

Assistant:

static int vm_builtin_extract(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	extract_aux_data sAux;
	jx9_hashmap *pMap;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Empty map, return  0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare the aux data */
	SyZero(&sAux, sizeof(extract_aux_data)-sizeof(sAux.zWorker));
	if( nArg > 1 ){
		sAux.iFlags = jx9_value_to_int(apArg[1]);
		if( nArg > 2 ){
			sAux.zPrefix = jx9_value_to_string(apArg[2], &sAux.Prefixlen);
		}
	}
	sAux.pVm = pCtx->pVm;
	/* Invoke the worker callback */
	jx9HashmapWalk(pMap, VmExtractCallback, &sAux);
	/* Number of variables successfully imported */
	jx9_result_int(pCtx, sAux.iCount);
	return JX9_OK;
}